

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::anon_unknown_1::ConsoleAssertionPrinter::print(ConsoleAssertionPrinter *this)

{
  size_t sVar1;
  undefined8 *in_RDI;
  ConsoleAssertionPrinter *in_stack_00000020;
  ConsoleAssertionPrinter *in_stack_00000030;
  ConsoleAssertionPrinter *in_stack_00000060;
  
  printSourceInfo(in_stack_00000020);
  sVar1 = Counts::total((Counts *)(in_RDI[1] + 0xb8));
  if (sVar1 == 0) {
    std::operator<<((ostream *)*in_RDI,'\n');
  }
  else {
    printResultType(this);
    printOriginalExpression(in_stack_00000030);
    printReconstructedExpression(in_stack_00000060);
  }
  printMessage(in_stack_00000060);
  return;
}

Assistant:

void print() const {
        printSourceInfo();
        if (stats.totals.assertions.total() > 0) {
            printResultType();
            printOriginalExpression();
            printReconstructedExpression();
        } else {
            stream << '\n';
        }
        printMessage();
    }